

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cloud.c
# Opt level: O2

void Cloud_PrintHashTable(CloudManager *dd)

{
  long lVar1;
  int i;
  long lVar2;
  
  lVar1 = 4;
  for (lVar2 = 0; lVar2 < dd->nNodesAlloc; lVar2 = lVar2 + 1) {
    putchar((uint)(*(int *)((long)&dd->tUnique->s + lVar1) == 0xfffffff) * 2 + 0x2b);
    lVar1 = lVar1 + 0x18;
  }
  putchar(10);
  return;
}

Assistant:

void Cloud_PrintHashTable( CloudManager * dd )
{
	int i;

	for ( i = 0; i < dd->nNodesAlloc; i++ )
		if ( dd->tUnique[i].v == CLOUD_CONST_INDEX )
			printf( "-" );
		else
			printf( "+" );
	printf( "\n" );
}